

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::PathPtr,char>(String *__return_storage_ptr__,kj *this,PathPtr *params,char *params_1)

{
  PathPtr *value;
  char *value_00;
  char local_39 [1];
  String local_38;
  PathPtr *local_20;
  char *params_local_1;
  PathPtr *params_local;
  
  local_20 = params;
  params_local_1 = (char *)this;
  params_local = (PathPtr *)__return_storage_ptr__;
  value = fwd<kj::PathPtr>((NoInfer<kj::PathPtr> *)this);
  toCharSequence<kj::PathPtr>(&local_38,value);
  value_00 = fwd<char>((NoInfer<char> *)local_20);
  local_39[0] = (char)toCharSequence<char>(value_00);
  _::concat<kj::String,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_38,(String *)local_39,
             (FixedArray<char,_1UL> *)params_1);
  String::~String(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}